

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O0

bool __thiscall
Scanner<UTF8EncodingPolicyBase<false>_>::TryReadCodePoint<false>
          (Scanner<UTF8EncodingPolicyBase<false>_> *this,EncodedCharPtr *startingLocation,
          EncodedCharPtr endOfSource,codepoint_t *outChar,bool *hasEscape,
          bool *outContainsMultiUnitChar)

{
  code *pcVar1;
  bool bVar2;
  OLECHAR OVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  uint local_44;
  bool *pbStack_40;
  codepoint_t ch;
  bool *outContainsMultiUnitChar_local;
  bool *hasEscape_local;
  codepoint_t *outChar_local;
  EncodedCharPtr endOfSource_local;
  EncodedCharPtr *startingLocation_local;
  Scanner<UTF8EncodingPolicyBase<false>_> *this_local;
  
  pbStack_40 = outContainsMultiUnitChar;
  outContainsMultiUnitChar_local = hasEscape;
  hasEscape_local = (bool *)outChar;
  outChar_local = (codepoint_t *)endOfSource;
  endOfSource_local = (EncodedCharPtr)startingLocation;
  startingLocation_local = (EncodedCharPtr *)this;
  if (outChar == (codepoint_t *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x172,"(outChar != nullptr)","outChar != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (pbStack_40 == (bool *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Scan.cpp"
                       ,0x173,"(outContainsMultiUnitChar != nullptr)",
                       "outContainsMultiUnitChar != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (*(codepoint_t **)endOfSource_local < outChar_local) {
    OVar3 = UTF8EncodingPolicyBase<false>::ReadFull<false>
                      (&this->super_UTF8EncodingPolicyBase<false>,
                       (EncodedCharPtr *)endOfSource_local,(EncodedCharPtr)outChar_local);
    local_44 = (uint)(ushort)OVar3;
    BVar4 = FBigChar(local_44);
    if (BVar4 == 0) {
      if ((local_44 == 0x5c) &&
         (bVar2 = TryReadEscape(this,(EncodedCharPtr *)endOfSource_local,
                                (EncodedCharPtr)outChar_local,&local_44), bVar2)) {
        *outContainsMultiUnitChar_local = true;
      }
    }
    else {
      BVar4 = UTF8EncodingPolicyBase<false>::IsMultiUnitChar((OLECHAR)local_44);
      if (BVar4 != 0) {
        *pbStack_40 = true;
      }
      if (((this->es6UnicodeMode & 1U) != 0) &&
         (bVar2 = Js::NumberUtilities::IsSurrogateLowerPart(local_44), bVar2)) {
        bVar2 = TryReadCodePointRest<false>
                          (this,local_44,(EncodedCharPtr *)endOfSource_local,
                           (EncodedCharPtr)outChar_local,(codepoint_t *)hasEscape_local,pbStack_40);
        return bVar2;
      }
    }
    *(uint *)hasEscape_local = local_44;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

inline bool Scanner<EncodingPolicy>::TryReadCodePoint(EncodedCharPtr &startingLocation, EncodedCharPtr endOfSource, codepoint_t *outChar, bool *hasEscape, bool *outContainsMultiUnitChar)
{
    Assert(outChar != nullptr);
    Assert(outContainsMultiUnitChar != nullptr);

    if (startingLocation >= endOfSource)
    {
        return false;
    }

    codepoint_t ch = this->template ReadFull<bScan>(startingLocation, endOfSource);
    if (FBigChar(ch))
    {
        if (this->IsMultiUnitChar(static_cast<OLECHAR>(ch)))
        {
            *outContainsMultiUnitChar = true;
        }

        if (es6UnicodeMode && Js::NumberUtilities::IsSurrogateLowerPart(ch))
        {
            return TryReadCodePointRest<bScan>(ch, startingLocation, endOfSource, outChar, outContainsMultiUnitChar);
        }
    }
    else if (ch == '\\' && TryReadEscape(startingLocation, endOfSource, &ch))
    {
        *hasEscape = true;
    }

    *outChar = ch;
    return true;
}